

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_2::IdentityGeometryShaderTestCase::initPrograms
          (IdentityGeometryShaderTestCase *this,SourceCollections *programCollection)

{
  TessPrimitiveType TVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  allocator<char> local_202;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [40];
  ostringstream src;
  string local_190 [368];
  
  addVertexAndFragmentShaders(programCollection);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&src,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(vertices = 4) out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
                          );
  poVar4 = std::operator<<(poVar4,"    float inner0;\n");
  poVar4 = std::operator<<(poVar4,"    float inner1;\n");
  poVar4 = std::operator<<(poVar4,"    float outer0;\n");
  poVar4 = std::operator<<(poVar4,"    float outer1;\n");
  poVar4 = std::operator<<(poVar4,"    float outer2;\n");
  poVar4 = std::operator<<(poVar4,"    float outer3;\n");
  poVar4 = std::operator<<(poVar4,"} sb_levels;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_vertex_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_patch_color[];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,
                           "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[0] = sb_levels.inner0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[1] = sb_levels.inner1;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[0] = sb_levels.outer0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[1] = sb_levels.outer1;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[2] = sb_levels.outer2;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[3] = sb_levels.outer3;\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"tesc",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"tese_to_frag",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1c0);
  TVar1 = this->m_primitiveType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"v_fragment_color",&local_201);
  generateTessellationEvaluationShader(&local_1e0,TVar1,&local_200);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&src,&local_1e0);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"tese_to_geom",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1c0);
  TVar1 = this->m_primitiveType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"v_evaluated_color",&local_201);
  generateTessellationEvaluationShader(&local_1e0,TVar1,&local_200);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&src,&local_1e0);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&src,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_geometry_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(");
  if ((ulong)this->m_primitiveType < 3) {
    pcVar3 = *(char **)(&DAT_00c09440 + (ulong)this->m_primitiveType * 8);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,"layout(");
  if ((ulong)this->m_primitiveType < 3) {
    pcVar3 = *(char **)(&DAT_00c09458 + (ulong)this->m_primitiveType * 8);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,", max_vertices=");
  iVar2 = numVerticesPerPrimitive(this->m_primitiveType,false);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_evaluated_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_fragment_color;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n");
  poVar4 = std::operator<<(poVar4,"    {\n");
  poVar4 = std::operator<<(poVar4,"        gl_Position = gl_in[ndx].gl_Position;\n");
  poVar4 = std::operator<<(poVar4,"        v_fragment_color = v_evaluated_color[ndx];\n");
  poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
  poVar4 = std::operator<<(poVar4,"    }\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"geom",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void IdentityGeometryShaderTestCase::initPrograms (vk::SourceCollections& programCollection) const
{
	addVertexAndFragmentShaders(programCollection);

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(vertices = 4) out;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
			<< "    float inner0;\n"
			<< "    float inner1;\n"
			<< "    float outer0;\n"
			<< "    float outer1;\n"
			<< "    float outer2;\n"
			<< "    float outer3;\n"
			<< "} sb_levels;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_vertex_color[];\n"
			<< "layout(location = 0) out highp vec4 v_patch_color[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = sb_levels.inner0;\n"
			<< "    gl_TessLevelInner[1] = sb_levels.inner1;\n"
			<< "    gl_TessLevelOuter[0] = sb_levels.outer0;\n"
			<< "    gl_TessLevelOuter[1] = sb_levels.outer1;\n"
			<< "    gl_TessLevelOuter[2] = sb_levels.outer2;\n"
			<< "    gl_TessLevelOuter[3] = sb_levels.outer3;\n"
			<<	"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		programCollection.glslSources.add("tese_to_frag")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_fragment_color"));
		programCollection.glslSources.add("tese_to_geom")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_evaluated_color"));
	}

	// Geometry shader
	{
		std::ostringstream	src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(m_primitiveType, false) << ") in;\n"
			<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(m_primitiveType, false)
						 << ", max_vertices=" << numVerticesPerPrimitive(m_primitiveType, false) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_evaluated_color[];\n"
			<< "layout(location = 0) out highp vec4 v_fragment_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			<< "    {\n"
			<< "        gl_Position = gl_in[ndx].gl_Position;\n"
			<< "        v_fragment_color = v_evaluated_color[ndx];\n"
			<< "        EmitVertex();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}